

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

void __thiscall amrex::BoxArray::uniqify(BoxArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int dir;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  ulong uVar14;
  IntVect IVar15;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  int local_38 [3];
  
  p_Var1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var1->_M_use_count != 1)
     ) {
    local_48 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<amrex::BARef,std::allocator<amrex::BARef>,amrex::BARef&>
              (&_Stack_40,(BARef **)local_48,(allocator<amrex::BARef> *)local_38,
               (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_40._M_pi;
    local_48 = (undefined1  [8])peVar2;
    _Stack_40._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  else {
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->hash)._M_h._M_element_count != 0) {
      std::
      _Hashtable<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(peVar2->hash)._M_h);
      ((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      has_hashmap = false;
    }
  }
  IVar15 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar6 = IVar15.vect[2];
  local_38[0] = IVar15.vect[0];
  local_38[1] = IVar15.vect[1];
  local_38[2] = IVar15.vect[2];
  iVar5 = IVar15.vect[0];
  if ((iVar6 != 1 || iVar5 != 1) || IVar15.vect._0_8_ >> 0x20 != 1) {
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data;
    uVar11 = (int)((long)*(pointer *)
                          ((long)&(peVar2->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar3 >> 2) * -0x49249249;
    if (0 < (int)uVar11) {
      iVar10 = IVar15.vect[1];
      lVar13 = lVar3 + 0xc;
      uVar14 = 0;
      do {
        puVar12 = (uint *)(uVar14 * 0x1c + lVar3);
        if (iVar10 == 1 && iVar5 == 1) {
          if (iVar6 != 1) {
            uVar4 = puVar12[1];
            goto LAB_004542b1;
          }
        }
        else {
          uVar4 = *puVar12;
          if (iVar5 != 1) {
            if (iVar5 == 4) {
              if ((int)uVar4 < 0) {
                uVar4 = (int)uVar4 >> 2;
              }
              else {
                uVar4 = uVar4 >> 2;
              }
            }
            else if (iVar5 == 2) {
              if ((int)uVar4 < 0) {
                uVar4 = (int)uVar4 >> 1;
              }
              else {
                uVar4 = uVar4 >> 1;
              }
            }
            else if ((int)uVar4 < 0) {
              uVar4 = ~((int)~uVar4 / iVar5);
            }
            else {
              uVar4 = (int)uVar4 / iVar5;
            }
          }
          *puVar12 = uVar4;
          uVar4 = puVar12[1];
          if (iVar10 != 1) {
            if (iVar10 == 4) {
              if ((int)uVar4 < 0) {
                uVar4 = (int)uVar4 >> 2;
              }
              else {
                uVar4 = uVar4 >> 2;
              }
            }
            else if (iVar10 == 2) {
              if ((int)uVar4 < 0) {
                uVar4 = (int)uVar4 >> 1;
              }
              else {
                uVar4 = uVar4 >> 1;
              }
            }
            else if ((int)uVar4 < 0) {
              uVar4 = ~((int)~uVar4 / iVar10);
            }
            else {
              uVar4 = (int)uVar4 / iVar10;
            }
          }
LAB_004542b1:
          puVar12[1] = uVar4;
          uVar4 = puVar12[2];
          if (iVar6 != 1) {
            if (iVar6 == 4) {
              if ((int)uVar4 < 0) {
                uVar4 = (int)uVar4 >> 2;
              }
              else {
                uVar4 = uVar4 >> 2;
              }
            }
            else if (iVar6 == 2) {
              if ((int)uVar4 < 0) {
                uVar4 = (int)uVar4 >> 1;
              }
              else {
                uVar4 = uVar4 >> 1;
              }
            }
            else if ((int)uVar4 < 0) {
              uVar4 = ~((int)~uVar4 / iVar6);
            }
            else {
              uVar4 = (int)uVar4 / iVar6;
            }
          }
          puVar12[2] = uVar4;
          uVar4 = puVar12[6];
          if (uVar4 == 0) {
            uVar4 = puVar12[3];
            if (iVar5 != 1) {
              if (iVar5 == 4) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 2;
                }
                else {
                  uVar4 = uVar4 >> 2;
                }
              }
              else if (iVar5 == 2) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 1;
                }
                else {
                  uVar4 = uVar4 >> 1;
                }
              }
              else if ((int)uVar4 < 0) {
                uVar4 = ~((int)~uVar4 / iVar5);
              }
              else {
                uVar4 = (int)uVar4 / iVar5;
              }
            }
            puVar12[3] = uVar4;
            uVar4 = puVar12[4];
            if (iVar10 != 1) {
              if (iVar10 == 4) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 2;
                }
                else {
                  uVar4 = uVar4 >> 2;
                }
              }
              else if (iVar10 == 2) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 1;
                }
                else {
                  uVar4 = uVar4 >> 1;
                }
              }
              else if ((int)uVar4 < 0) {
                uVar4 = ~((int)~uVar4 / iVar10);
              }
              else {
                uVar4 = (int)uVar4 / iVar10;
              }
            }
            puVar12[4] = uVar4;
            uVar4 = puVar12[5];
            if (iVar6 != 1) {
              if (iVar6 == 4) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 2;
                }
                else {
                  uVar4 = uVar4 >> 2;
                }
              }
              else if (iVar6 == 2) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 1;
                }
                else {
                  uVar4 = uVar4 >> 1;
                }
              }
              else if ((int)uVar4 < 0) {
                uVar4 = ~((int)~uVar4 / iVar6);
              }
              else {
                uVar4 = (int)uVar4 / iVar6;
              }
            }
          }
          else {
            local_48 = (undefined1  [8])0x0;
            _Stack_40._M_pi = _Stack_40._M_pi & 0xffffffff00000000;
            lVar9 = 0;
            do {
              if (((uVar4 >> ((uint)lVar9 & 0x1f) & 1) != 0) &&
                 (*(int *)(lVar13 + lVar9 * 4) % local_38[lVar9] != 0)) {
                *(undefined4 *)(local_48 + lVar9 * 4) = 1;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            uVar7 = puVar12[3];
            if (iVar5 != 1) {
              if (iVar5 == 4) {
                if ((int)uVar7 < 0) {
                  uVar7 = (int)uVar7 >> 2;
                }
                else {
                  uVar7 = uVar7 >> 2;
                }
              }
              else if (iVar5 == 2) {
                if ((int)uVar7 < 0) {
                  uVar7 = (int)uVar7 >> 1;
                }
                else {
                  uVar7 = uVar7 >> 1;
                }
              }
              else if ((int)uVar7 < 0) {
                uVar7 = ~((int)~uVar7 / iVar5);
              }
              else {
                uVar7 = (int)uVar7 / iVar5;
              }
            }
            uVar8 = puVar12[4];
            if (iVar10 != 1) {
              if (iVar10 == 4) {
                if ((int)uVar8 < 0) {
                  uVar8 = (int)uVar8 >> 2;
                }
                else {
                  uVar8 = uVar8 >> 2;
                }
              }
              else if (iVar10 == 2) {
                if ((int)uVar8 < 0) {
                  uVar8 = (int)uVar8 >> 1;
                }
                else {
                  uVar8 = uVar8 >> 1;
                }
              }
              else if ((int)uVar8 < 0) {
                uVar8 = ~((int)~uVar8 / iVar10);
              }
              else {
                uVar8 = (int)uVar8 / iVar10;
              }
            }
            uVar4 = puVar12[5];
            if (iVar6 != 1) {
              if (iVar6 == 4) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 2;
                }
                else {
                  uVar4 = uVar4 >> 2;
                }
              }
              else if (iVar6 == 2) {
                if ((int)uVar4 < 0) {
                  uVar4 = (int)uVar4 >> 1;
                }
                else {
                  uVar4 = uVar4 >> 1;
                }
              }
              else if ((int)uVar4 < 0) {
                uVar4 = ~((int)~uVar4 / iVar6);
              }
              else {
                uVar4 = (int)uVar4 / iVar6;
              }
            }
            puVar12[3] = uVar7 + local_48._0_4_;
            puVar12[4] = uVar8 + local_48._4_4_;
            uVar4 = uVar4 + (int)_Stack_40._M_pi;
          }
          puVar12[5] = uVar4;
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x1c;
      } while (uVar14 != (uVar11 & 0x7fffffff));
    }
    local_48 = (undefined1  [8])0x100000001;
    _Stack_40._M_pi._0_4_ = 1;
    BATransformer::set_coarsen_ratio(&this->m_bat,(IntVect *)local_48);
  }
  p_Var1 = (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

void
BoxArray::uniqify ()
{
    if (m_ref.use_count() == 1) {
        clear_hash_bin();
    } else {
        auto p = std::make_shared<BARef>(*m_ref);
        std::swap(m_ref,p);
    }
    IntVect cr = crseRatio();
    if (cr != IntVect::TheUnitVector()) {
        const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++) {
            m_ref->m_abox[i].coarsen(cr);
        }
        m_bat.set_coarsen_ratio(IntVect::TheUnitVector());
    }
    m_simplified_list.reset();
}